

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O1

void __thiscall
testing::StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource>::StrictMock
          (StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource> *this)

{
  Mock::FailUninterestingCalls((uintptr_t)this);
  memset(this,0,0x98);
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__MockCertIssuerSource_006d3ad8;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.
              super_UntypedFunctionMockerBase);
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_006d4b78;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
              super_UntypedFunctionMockerBase);
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_006d4d68;
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__StrictMock_006d3a48;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }